

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress_sequences.c
# Opt level: O3

size_t ZSTD_crossEntropyCost(short *norm,uint accuracyLog,uint *count,uint max)

{
  byte bVar1;
  ulong uVar2;
  uint uVar3;
  short sVar4;
  uint uVar5;
  
  if (7 < accuracyLog && accuracyLog - 8 != 0) {
    __assert_fail("accuracyLog <= 8",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_sequences.c"
                  ,0x91,
                  "size_t ZSTD_crossEntropyCost(const short *, unsigned int, const unsigned int *, const unsigned int)"
                 );
  }
  uVar2 = 0;
  uVar3 = 0;
  do {
    sVar4 = norm[uVar3];
    if (norm[uVar3] == -1) {
      sVar4 = 1;
    }
    bVar1 = -(char)(accuracyLog - 8) & 0x1f;
    uVar5 = (int)sVar4 << bVar1;
    if ((int)sVar4 << bVar1 == 0) {
      __assert_fail("norm256 > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_sequences.c"
                    ,0x95,
                    "size_t ZSTD_crossEntropyCost(const short *, unsigned int, const unsigned int *, const unsigned int)"
                   );
    }
    if (0xff < uVar5) {
      __assert_fail("norm256 < 256",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_sequences.c"
                    ,0x96,
                    "size_t ZSTD_crossEntropyCost(const short *, unsigned int, const unsigned int *, const unsigned int)"
                   );
    }
    uVar2 = uVar2 + kInverseProbabilityLog256[uVar5] * count[uVar3];
    uVar3 = uVar3 + 1;
  } while (uVar3 <= max);
  return uVar2 >> 8;
}

Assistant:

size_t ZSTD_crossEntropyCost(short const* norm, unsigned accuracyLog,
                             unsigned const* count, unsigned const max)
{
    unsigned const shift = 8 - accuracyLog;
    size_t cost = 0;
    unsigned s;
    assert(accuracyLog <= 8);
    for (s = 0; s <= max; ++s) {
        unsigned const normAcc = (norm[s] != -1) ? (unsigned)norm[s] : 1;
        unsigned const norm256 = normAcc << shift;
        assert(norm256 > 0);
        assert(norm256 < 256);
        cost += count[s] * kInverseProbabilityLog256[norm256];
    }
    return cost >> 8;
}